

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

string * __thiscall
iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *actual,char *matcher_str,
          AssertionResult *ar)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  iu_global_format_stringstream strm;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [376];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"error: Expected: ",0x11);
  iVar1 = (int)(ostream *)local_1a0;
  if (actual == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(actual);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,actual,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n  Actual: ",0xb);
  if (this == (detail *)0x0) {
    std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)this,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\nWhich is: ",0xb);
  __s = *(char **)matcher_str;
  if (__s == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string MatcherAssertionFailureMessage(const char* actual, const char* matcher_str
                                                    , const AssertionResult& ar)
{
    iu_global_format_stringstream strm;
    strm << "error: Expected: " << matcher_str
        << "\n  Actual: " << actual
        << "\nWhich is: " << ar.message();
    return strm.str();
}